

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_start_buffer(nk_context *ctx,nk_command_buffer *buffer)

{
  nk_command_buffer *buffer_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3ac1,"void nk_start_buffer(struct nk_context *, struct nk_command_buffer *)");
  }
  if (buffer == (nk_command_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3ac2,"void nk_start_buffer(struct nk_context *, struct nk_command_buffer *)");
  }
  if ((ctx != (nk_context *)0x0) && (buffer != (nk_command_buffer *)0x0)) {
    buffer->begin = (ctx->memory).allocated;
    buffer->end = buffer->begin;
    buffer->last = buffer->begin;
    (buffer->clip).x = -8192.0;
    (buffer->clip).y = -8192.0;
    (buffer->clip).w = 16384.0;
    (buffer->clip).h = 16384.0;
  }
  return;
}

Assistant:

NK_LIB void
nk_start_buffer(struct nk_context *ctx, struct nk_command_buffer *buffer)
{
    NK_ASSERT(ctx);
    NK_ASSERT(buffer);
    if (!ctx || !buffer) return;
    buffer->begin = ctx->memory.allocated;
    buffer->end = buffer->begin;
    buffer->last = buffer->begin;
    buffer->clip = nk_null_rect;
}